

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_verify.cc
# Opt level: O2

int ASN1_item_verify(ASN1_ITEM *it,X509_ALGOR *algor1,ASN1_BIT_STRING *signature,void *data,
                    EVP_PKEY *pkey)

{
  int line;
  int iVar1;
  uchar *sig;
  int iVar2;
  uint8_t *buf_in;
  size_t sig_len;
  EVP_MD_CTX ctx;
  
  if (pkey == (EVP_PKEY *)0x0) {
    iVar1 = 0x43;
    line = 0x21;
LAB_002d3489:
    iVar2 = 0;
    ERR_put_error(0xb,0,iVar1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/a_verify.cc"
                  ,line);
  }
  else {
    if (signature->type == 3) {
      iVar1 = ASN1_BIT_STRING_num_bytes((ASN1_BIT_STRING *)signature,&sig_len);
      if (iVar1 == 0) {
        iVar1 = 0x6d;
        line = 0x28;
        goto LAB_002d3489;
      }
    }
    else {
      iVar1 = ASN1_STRING_length(signature);
      sig_len = (size_t)iVar1;
    }
    buf_in = (uint8_t *)0x0;
    EVP_MD_CTX_init((EVP_MD_CTX *)&ctx);
    iVar1 = x509_digest_verify_init(&ctx,(X509_ALGOR *)algor1,(EVP_PKEY *)pkey);
    iVar2 = 0;
    if (iVar1 != 0) {
      iVar1 = ASN1_item_i2d((ASN1_VALUE *)data,&buf_in,it);
      if (buf_in != (uint8_t *)0x0) {
        sig = ASN1_STRING_get0_data((ASN1_STRING *)signature);
        iVar1 = EVP_DigestVerify(&ctx,sig,sig_len,buf_in,(long)iVar1);
        if (iVar1 == 0) {
          iVar2 = 0;
          ERR_put_error(0xb,0,6,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/a_verify.cc"
                        ,0x40);
        }
        else {
          iVar2 = 1;
        }
      }
    }
    OPENSSL_free(buf_in);
    EVP_MD_CTX_cleanup((EVP_MD_CTX *)&ctx);
  }
  return iVar2;
}

Assistant:

int ASN1_item_verify(const ASN1_ITEM *it, const X509_ALGOR *a,
                     const ASN1_BIT_STRING *signature, void *asn,
                     EVP_PKEY *pkey) {
  if (!pkey) {
    OPENSSL_PUT_ERROR(X509, ERR_R_PASSED_NULL_PARAMETER);
    return 0;
  }

  size_t sig_len;
  if (signature->type == V_ASN1_BIT_STRING) {
    if (!ASN1_BIT_STRING_num_bytes(signature, &sig_len)) {
      OPENSSL_PUT_ERROR(X509, X509_R_INVALID_BIT_STRING_BITS_LEFT);
      return 0;
    }
  } else {
    sig_len = (size_t)ASN1_STRING_length(signature);
  }

  EVP_MD_CTX ctx;
  uint8_t *buf_in = NULL;
  int ret = 0, inl = 0;
  EVP_MD_CTX_init(&ctx);

  if (!x509_digest_verify_init(&ctx, a, pkey)) {
    goto err;
  }

  inl = ASN1_item_i2d(reinterpret_cast<ASN1_VALUE *>(asn), &buf_in, it);

  if (buf_in == NULL) {
    goto err;
  }

  if (!EVP_DigestVerify(&ctx, ASN1_STRING_get0_data(signature), sig_len, buf_in,
                        inl)) {
    OPENSSL_PUT_ERROR(X509, ERR_R_EVP_LIB);
    goto err;
  }

  ret = 1;

err:
  OPENSSL_free(buf_in);
  EVP_MD_CTX_cleanup(&ctx);
  return ret;
}